

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshCheck(word *t,int nVars,int *pW)

{
  int iVar1;
  int Chow [16];
  int aiStack_68 [18];
  
  iVar1 = Abc_TtIsUnate(t,nVars);
  if (iVar1 != 0) {
    Abc_TtMakePosUnate(t,nVars);
    Extra_ThreshComputeChow(t,nVars,aiStack_68);
    Extra_ThreshSortByChow(t,nVars,aiStack_68);
    iVar1 = Extra_ThreshSelectWeights(t,nVars,pW);
    return iVar1;
  }
  return 0;
}

Assistant:

int Extra_ThreshCheck(word * t, int nVars, int * pW) {
    int Chow0, Chow[16];
    if (!Abc_TtIsUnate(t, nVars))
        return 0;
    Abc_TtMakePosUnate(t, nVars);
    Chow0 = Extra_ThreshComputeChow(t, nVars, Chow);
    Extra_ThreshSortByChow(t, nVars, Chow);
    return Extra_ThreshSelectWeights(t, nVars, pW);
}